

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O2

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
          (any_executor_base *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f)

{
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  non_const_lvalue<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>_>
  f2;
  function_view fVar2;
  bad_executor ex;
  allocator<void> local_51;
  executor_function local_50;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> local_48;
  
  if (this->target_ == (void *)0x0) {
    local_50.impl_ = (impl_base *)&PTR__exception_00450588;
    asio::detail::throw_exception<asio::execution::bad_executor>((bad_executor *)&local_50);
    std::exception::~exception((exception *)&local_50);
  }
  else {
    UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
    if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
      fVar2.function_ = f;
      fVar2.complete_ =
           asio::detail::executor_function_view::
           complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
      ;
      (*UNRECOVERED_JUMPTABLE)(this,fVar2);
      return;
    }
    p_Var1 = this->target_fns_->execute;
    asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::binder1
              (&local_48,&f->handler_);
    asio::detail::executor_function::
    executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
              (&local_50,
               (binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
                *)&local_48,&local_51);
    (*p_Var1)(this,&local_50);
    asio::detail::executor_function::~executor_function(&local_50);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }